

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

QString * __thiscall QString::left(QString *this,qsizetype n)

{
  ulong uVar1;
  ulong in_RDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QString *in_RDI;
  QString *this_00;
  ulong size;
  QArrayDataPointer<char16_t> *unicode;
  QString *this_01;
  
  this_00 = in_RDI;
  size = in_RDX;
  unicode = in_RSI;
  this_01 = in_RDI;
  uVar1 = QString::size((QString *)in_RSI);
  if (in_RDX < uVar1) {
    QArrayDataPointer<char16_t>::data(in_RSI);
    QString(this_01,(QChar *)unicode,size);
  }
  else {
    QString(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

QString QString::left(qsizetype n) const
{
    if (size_t(n) >= size_t(size()))
        return *this;
    return QString((const QChar*) d.data(), n);
}